

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O0

void MARGINAL::make_marginal<true>(data *sm,example *ec)

{
  bool bVar1;
  char *pcVar2;
  feature_value *pfVar3;
  ulong *puVar4;
  features_value_index_iterator *this;
  ostream *poVar5;
  mapped_type *pmVar6;
  size_t sVar7;
  mapped_type *pmVar8;
  int __c;
  int __c_00;
  int __c_01;
  long in_RSI;
  iterator *rhs;
  features_value_iterator *pfVar9;
  long in_RDI;
  float fVar10;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_pair<expert,_expert>_>_&&>::value,_pair<iterator,_bool>_>
  _Var11;
  float weight;
  float marginal_pred;
  expert e;
  uint64_t key;
  uint64_t second_index;
  float second_value;
  uint64_t first_index;
  float first_value;
  iterator j;
  features *f;
  namespace_index n;
  iterator i;
  vw *all;
  float label;
  uint64_t mask;
  parameters *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe74;
  float fVar12;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe78;
  features *in_stack_fffffffffffffe80;
  features *in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffec9;
  features *in_stack_fffffffffffffed0;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false> local_c0;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false> local_b8;
  long local_b0;
  ulong local_a8;
  float local_9c;
  features_value_iterator local_98 [2];
  ulong local_88;
  feature_value local_7c;
  features_value_iterator local_78 [2];
  features_value_index_iterator local_68;
  features *local_58;
  byte local_49;
  iterator local_48;
  iterator local_38;
  undefined8 *local_28;
  undefined4 local_1c;
  uint64_t local_18;
  long local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = parameters::mask(in_stack_fffffffffffffe68);
  local_1c = *(undefined4 *)(local_10 + 0x6828);
  local_28 = *(undefined8 **)(local_8 + 0x6998);
  *(undefined4 *)(local_8 + 0x695c) = 0;
  *(undefined4 *)(local_8 + 0x6954) = 0;
  *(undefined4 *)(local_8 + 0x6958) = 0;
  *(undefined4 *)(local_8 + 0x6950) = 0;
  local_38 = example_predict::begin
                       ((example_predict *)
                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  do {
    local_48 = example_predict::end
                         ((example_predict *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    rhs = &local_48;
    bVar1 = example_predict::iterator::operator!=(&local_38,rhs);
    if (!bVar1) {
      return;
    }
    pcVar2 = example_predict::iterator::index(&local_38,(char *)rhs,__c);
    local_49 = (byte)pcVar2;
    if ((*(byte *)(local_8 + 0xe + ((ulong)pcVar2 & 0xff)) & 1) != 0) {
      example_predict::iterator::operator*(&local_38);
      std::swap<features>(in_stack_fffffffffffffed0,
                          (features *)CONCAT71(in_stack_fffffffffffffec9,in_stack_fffffffffffffec8))
      ;
      local_58 = example_predict::iterator::operator*(&local_38);
      features::clear((features *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      features::begin(in_stack_fffffffffffffe88);
      while( true ) {
        features::end(in_stack_fffffffffffffe88);
        pfVar9 = local_78;
        bVar1 = features_value_iterator::operator!=(&local_68.super_features_value_iterator,pfVar9);
        if (!bVar1) break;
        pfVar3 = features_value_iterator::value(&local_68.super_features_value_iterator);
        local_7c = *pfVar3;
        puVar4 = (ulong *)features_value_index_iterator::index(&local_68,(char *)pfVar9,__c_00);
        local_88 = *puVar4 & local_18;
        this = features_value_index_iterator::operator++
                         ((features_value_index_iterator *)
                          CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
        features::end(in_stack_fffffffffffffe88);
        pfVar9 = local_98;
        bVar1 = features_value_iterator::operator==(&this->super_features_value_iterator,pfVar9);
        if (bVar1) {
          poVar5 = std::operator<<((ostream *)&std::cout,"warning: id feature namespace has ");
          sVar7 = features::size((features *)0x3bce39);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7);
          poVar5 = std::operator<<(poVar5," features. Should be a multiple of 2");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          break;
        }
        pfVar3 = features_value_iterator::value(&local_68.super_features_value_iterator);
        local_9c = *pfVar3;
        puVar4 = (ulong *)features_value_index_iterator::index(&local_68,(char *)pfVar9,__c_01);
        local_a8 = *puVar4 & local_18;
        if ((((local_7c != 1.0) || (NAN(local_7c))) || (local_9c != 1.0)) || (NAN(local_9c))) {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "warning: bad id features, must have value 1.");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          fVar12 = in_stack_fffffffffffffe74;
        }
        else {
          local_b0 = local_a8 + *(long *)(local_10 + 0x6820);
          local_b8._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
               ::find((unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                       *)in_stack_fffffffffffffe68,(key_type *)0x3bcf41);
          local_c0._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
               ::end((unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                      *)in_stack_fffffffffffffe68);
          bVar1 = std::__detail::operator==(&local_b8,&local_c0);
          if (bVar1) {
            std::make_pair<float&,float&>((float *)in_stack_fffffffffffffe68,(float *)0x3bcfa5);
            std::make_pair<unsigned_long&,std::pair<float,float>>
                      ((unsigned_long *)
                       CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                       (pair<float,_float> *)in_stack_fffffffffffffe68);
            std::
            unordered_map<unsigned_long,std::pair<double,double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>>
            ::insert<std::pair<unsigned_long,std::pair<float,float>>>
                      ((unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                        *)in_stack_fffffffffffffe80,
                       (pair<unsigned_long,_std::pair<float,_float>_> *)in_stack_fffffffffffffe78);
            if ((*(byte *)(local_8 + 0x6948) & 1) != 0) {
              std::make_pair<MARGINAL::expert&,MARGINAL::expert&>
                        ((expert *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                         (expert *)in_stack_fffffffffffffe68);
              std::make_pair<unsigned_long&,std::pair<MARGINAL::expert,MARGINAL::expert>>
                        ((unsigned_long *)
                         CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                         (pair<MARGINAL::expert,_MARGINAL::expert> *)in_stack_fffffffffffffe68);
              _Var11 = std::
                       unordered_map<unsigned_long,std::pair<MARGINAL::expert,MARGINAL::expert>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>>
                       ::
                       insert<std::pair<unsigned_long,std::pair<MARGINAL::expert,MARGINAL::expert>>>
                                 ((unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                                   *)in_stack_fffffffffffffe80,
                                  (pair<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>
                                   *)in_stack_fffffffffffffe78);
              in_stack_fffffffffffffec8 = _Var11.second;
            }
          }
          pmVar6 = std::
                   unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                   ::operator[]((unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                (key_type *)in_stack_fffffffffffffe68);
          in_stack_fffffffffffffe88 = (features *)pmVar6->first;
          pmVar6 = std::
                   unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                   ::operator[]((unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                (key_type *)in_stack_fffffffffffffe68);
          fVar10 = (float)((double)in_stack_fffffffffffffe88 / pmVar6->second);
          features::push_back(in_stack_fffffffffffffe80,
                              (feature_value)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                              CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
          bVar1 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::empty((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(local_8 + (ulong)local_49 * 0x68 + 0x150));
          if (!bVar1) {
            in_stack_fffffffffffffe80 = (features *)&local_58->space_names;
            in_stack_fffffffffffffe78 =
                 (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_8 + (ulong)local_49 * 0x68 + 0x150);
            sVar7 = features::size((features *)0x3bd162);
            v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](in_stack_fffffffffffffe78,(sVar7 - 1) * 2);
            v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                        (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffe68);
          }
          fVar12 = in_stack_fffffffffffffe74;
          if ((*(byte *)(local_8 + 0x6948) & 1) != 0) {
            pmVar8 = std::
                     unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                     ::operator[]((unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                  (key_type *)in_stack_fffffffffffffe68);
            fVar12 = (pmVar8->first).weight;
            *(float *)(local_8 + 0x6950) = fVar12 * fVar10 + *(float *)(local_8 + 0x6950);
            *(float *)(local_8 + 0x6954) = fVar12 + *(float *)(local_8 + 0x6954);
            pmVar8 = std::
                     unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                     ::operator[]((unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                  (key_type *)in_stack_fffffffffffffe68);
            *(float *)(local_8 + 0x6958) = (pmVar8->second).weight + *(float *)(local_8 + 0x6958);
            fVar10 = (float)(**(code **)(*(long *)local_28[0x6a9] + 8))
                                      (fVar10,local_1c,(long *)local_28[0x6a9],*local_28);
            *(float *)(local_8 + 0x695c) = fVar12 * fVar10 + *(float *)(local_8 + 0x695c);
          }
        }
        features_value_index_iterator::operator++
                  ((features_value_index_iterator *)CONCAT44(fVar12,in_stack_fffffffffffffe70));
        in_stack_fffffffffffffe74 = fVar12;
      }
    }
    example_predict::iterator::operator++(&local_38);
  } while( true );
}

Assistant:

void make_marginal(data& sm, example& ec)
{
  uint64_t mask = sm.all->weights.mask();
  float label = ec.l.simple.label;
  vw& all = *sm.all;
  sm.alg_loss = 0.;
  sm.net_weight = 0.;
  sm.net_feature_weight = 0.;
  sm.average_pred = 0.;

  for (example::iterator i = ec.begin(); i != ec.end(); ++i)
  {
    namespace_index n = i.index();
    if (sm.id_features[n])
    {
      std::swap(sm.temp[n], *i);
      features& f = *i;
      f.clear();
      for (features::iterator j = sm.temp[n].begin(); j != sm.temp[n].end(); ++j)
      {
        float first_value = j.value();
        uint64_t first_index = j.index() & mask;
        if (++j == sm.temp[n].end())
        {
          cout << "warning: id feature namespace has " << sm.temp[n].size() << " features. Should be a multiple of 2"
               << endl;
          break;
        }
        float second_value = j.value();
        uint64_t second_index = j.index() & mask;
        if (first_value != 1. || second_value != 1.)
        {
          cout << "warning: bad id features, must have value 1." << endl;
          continue;
        }
        uint64_t key = second_index + ec.ft_offset;
        if (sm.marginals.find(key) == sm.marginals.end())  // need to initialize things.
        {
          sm.marginals.insert(make_pair(key, make_pair(sm.initial_numerator, sm.initial_denominator)));
          if (sm.compete)
          {
            expert e = {0, 0, 1.};
            sm.expert_state.insert(make_pair(key, make_pair(e, e)));
          }
        }
        float marginal_pred = (float)(sm.marginals[key].first / sm.marginals[key].second);
        f.push_back(marginal_pred, first_index);
        if (!sm.temp[n].space_names.empty())
          f.space_names.push_back(sm.temp[n].space_names[2 * (f.size() - 1)]);

        if (sm.compete)  // compute the prediction from the marginals using the weights
        {
          float weight = sm.expert_state[key].first.weight;
          sm.average_pred += weight * marginal_pred;
          sm.net_weight += weight;
          sm.net_feature_weight += sm.expert_state[key].second.weight;
          if (is_learn)
            sm.alg_loss += weight * all.loss->getLoss(all.sd, marginal_pred, label);
        }
      }
    }
  }
}